

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

uint32_t __thiscall AmpIO::ReadSafetyAmpDisable(AmpIO *this)

{
  uint32_t uVar1;
  ostream *this_00;
  uint local_14;
  uint32_t val;
  AmpIO *this_local;
  
  local_14 = 0;
  uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar1 == 0x514c4131) {
    uVar1 = BoardIO::ReadStatus((BoardIO *)this);
    local_14 = (uVar1 & 0xf0) >> 4;
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "ReadSafetyAmpDisable not implemented for this hardware");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return local_14;
}

Assistant:

uint32_t AmpIO::ReadSafetyAmpDisable(void) const
{
    uint32_t val = 0;
    if (GetHardwareVersion() == QLA1_String) {
        // This field has been present in the Status register since Firmware Rev 3
        // (Firmware Rev 2 used register 11 and Firmware Rev 1 did not have this field)
        val = (ReadStatus()&0x000000F0) >> 4;
    }
    else {
        // This could be implemented by issuing NumMotors quadlet reads
        std::cerr << "ReadSafetyAmpDisable not implemented for this hardware" << std::endl;
    }
    return val;
}